

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings
          (CThreadSynchronizationInfo *this)

{
  _LIST_ENTRY *pvMem;
  _LIST_ENTRY *p_Var1;
  _LIST_ENTRY *p_Var2;
  uint uVar3;
  PAL_ERROR PVar4;
  ulong uVar5;
  PAL_ERROR PVar6;
  ulong uVar7;
  
  uVar3 = this->m_lPendingSignalingCount;
  if ((int)uVar3 < 0) {
    fprintf(_stderr,"] %s %s:%d","RunDeferredThreadConditionSignalings",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xfaa);
    fprintf(_stderr,"Expression: 0 <= m_lPendingSignalingCount\n");
    uVar3 = this->m_lPendingSignalingCount;
  }
  if ((int)uVar3 < 1) {
    PVar6 = 0;
  }
  else {
    uVar5 = 10;
    if (uVar3 < 10) {
      uVar5 = (ulong)uVar3;
    }
    PVar6 = 0;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      PVar4 = CPalSynchronizationManager::SignalThreadCondition
                        (&(this->m_rgpthrPendingSignalings[uVar7]->synchronizationInfo).
                          m_tnwdNativeData);
      if (PVar4 != 0) {
        PVar6 = PVar4;
      }
      CPalThread::ReleaseThreadReference(this->m_rgpthrPendingSignalings[uVar7]);
    }
    if (10 < this->m_lPendingSignalingCount) {
      while( true ) {
        pvMem = (this->m_lePendingSignalingsOverflowList).Flink;
        if (pvMem == &this->m_lePendingSignalingsOverflowList) break;
        p_Var1 = pvMem->Flink;
        p_Var2 = pvMem->Blink;
        p_Var2->Flink = p_Var1;
        p_Var1->Blink = p_Var2;
        PVar4 = CPalSynchronizationManager::SignalThreadCondition
                          ((ThreadNativeWaitData *)(pvMem[1].Flink + 0x1a));
        if (PVar4 != 0) {
          PVar6 = PVar4;
        }
        CPalThread::ReleaseThreadReference((CPalThread *)pvMem[1].Flink);
        InternalFree(pvMem);
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      if (this->m_lPendingSignalingCount != (int)uVar5) {
        fprintf(_stderr,"] %s %s:%d","RunDeferredThreadConditionSignalings",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xfe3);
        fprintf(_stderr,"Expression: lIdx == m_lPendingSignalingCount\n");
      }
    }
    this->m_lPendingSignalingCount = 0;
  }
  return PVar6;
}

Assistant:

PAL_ERROR CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings()
    {
        PAL_ERROR palErr = NO_ERROR;

        _ASSERTE(0 <= m_lPendingSignalingCount);

        if (0 < m_lPendingSignalingCount)
        {
            LONG lArrayPendingSignalingCount =
                min(PendingSignalingsArraySize, m_lPendingSignalingCount);
            LONG lIdx = 0;
            PAL_ERROR palTempErr;

            // Signal all the pending signalings from the array
            for (lIdx = 0; lIdx < lArrayPendingSignalingCount; lIdx++)
            {
                // Do the actual signaling
                palTempErr = CPalSynchronizationManager::SignalThreadCondition(
                    m_rgpthrPendingSignalings[lIdx]->synchronizationInfo.GetNativeData());
                if (NO_ERROR != palTempErr)
                {
                    palErr = palTempErr;
                }

                // Release the thread reference
                m_rgpthrPendingSignalings[lIdx]->ReleaseThreadReference();
            }

            // Signal any pending signalings from the array overflow list
            if (m_lPendingSignalingCount > PendingSignalingsArraySize)
            {
                PLIST_ENTRY pLink;
                DeferredSignalingListNode * pdsln;

                while (!IsListEmpty(&m_lePendingSignalingsOverflowList))
                {
                    // Remove a node from the head of the queue
                    // Note: no need to synchronize the access to this list since
                    // it is meant to be accessed only by the owner thread.
                    pLink = RemoveHeadList(&m_lePendingSignalingsOverflowList);
                    pdsln = CONTAINING_RECORD(pLink,
                                              DeferredSignalingListNode,
                                              Link);

                    // Do the actual signaling
                    palTempErr = CPalSynchronizationManager::SignalThreadCondition(
                        pdsln->pthrTarget->synchronizationInfo.GetNativeData());
                    if (NO_ERROR != palTempErr)
                    {
                        palErr = palTempErr;
                    }

                    // Release the thread reference
                    pdsln->pthrTarget->ReleaseThreadReference();

                    // Delete the node
                    InternalDelete(pdsln);

                    lIdx += 1;
                }

                _ASSERTE(lIdx == m_lPendingSignalingCount);
            }

            // Reset the counter of pending signalings for this thread
            m_lPendingSignalingCount = 0;
        }

        return palErr;
    }